

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PType * __thiscall
FTypeTable::FindType
          (FTypeTable *this,PClass *metatype,intptr_t parm1,intptr_t parm2,size_t *bucketnum)

{
  uint uVar1;
  size_t sVar2;
  MetaClass *pMVar3;
  PType *local_48;
  PType *type;
  size_t bucket;
  size_t *bucketnum_local;
  intptr_t parm2_local;
  intptr_t parm1_local;
  PClass *metatype_local;
  FTypeTable *this_local;
  
  sVar2 = Hash(metatype,parm1,parm2);
  if (bucketnum != (size_t *)0x0) {
    *bucketnum = sVar2 % 0x3fd;
  }
  local_48 = this->TypeHash[sVar2 % 0x3fd];
  while( true ) {
    if (local_48 == (PType *)0x0) {
      return (PType *)0x0;
    }
    pMVar3 = PType::GetClass(local_48);
    if ((pMVar3->TypeTableType == metatype) &&
       (uVar1 = (*(local_48->super_PTypeBase).super_DObject._vptr_DObject[0x13])
                          (local_48,parm1,parm2), (uVar1 & 1) != 0)) break;
    local_48 = local_48->HashNext;
  }
  return local_48;
}

Assistant:

PType *FTypeTable::FindType(PClass *metatype, intptr_t parm1, intptr_t parm2, size_t *bucketnum)
{
	size_t bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	if (bucketnum != NULL)
	{
		*bucketnum = bucket;
	}
	for (PType *type = TypeHash[bucket]; type != NULL; type = type->HashNext)
	{
		if (type->GetClass()->TypeTableType == metatype && type->IsMatch(parm1, parm2))
		{
			return type;
		}
	}
	return NULL;
}